

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu.cpp
# Opt level: O1

void __thiscall
geemuboi::test::core::CpuTest_ld_ma16_sp_Test::TestBody(CpuTest_ld_ma16_sp_Test *this)

{
  MockMmu *mock_obj;
  FunctionMocker<unsigned_short_(unsigned_short)> *this_00;
  FunctionMocker<void_(unsigned_short,_unsigned_short)> *this_01;
  undefined2 uVar1;
  bool bVar2;
  int iVar3;
  TypedExpectation<unsigned_short_(unsigned_short)> *this_02;
  char *message;
  Registers expected_regs;
  AssertionResult gtest_ar;
  Matcher<unsigned_short> local_a0;
  linked_ptr<int> local_88;
  undefined1 local_78 [16];
  linked_ptr<const_testing::MatcherInterface<const_unsigned_short_&>_> local_68;
  undefined1 local_58 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_50;
  linked_ptr<const_testing::MatcherInterface<const_unsigned_short_&>_> local_48;
  undefined1 local_38 [24];
  
  (this->super_CpuTest).regs.sp = 0xffee;
  mock_obj = &(this->super_CpuTest).mmu;
  uVar1 = (this->super_CpuTest).regs.pc;
  testing::Matcher<unsigned_short>::Matcher(&local_a0,uVar1 + 1);
  this_00 = &(this->super_CpuTest).mmu.gmock1_read_word_11;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)this_00,mock_obj);
  testing::internal::FunctionMocker<unsigned_short_(unsigned_short)>::With
            ((MockSpec<unsigned_short_(unsigned_short)> *)local_78,this_00,&local_a0);
  testing::internal::GetWithoutMatchers();
  this_02 = testing::internal::MockSpec<unsigned_short_(unsigned_short)>::InternalExpectedAt
                      ((MockSpec<unsigned_short_(unsigned_short)> *)local_78,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/cjuub[P]geemuboi/test/core/test_cpu.cpp"
                       ,0xe3,"mmu","read_word(regs.pc + 1)");
  local_88.value_ = (int *)operator_new(4);
  *local_88.value_ = 0xccdd;
  local_88.link_.next_ = &local_88.link_;
  local_38._0_8_ = operator_new(0x10);
  ((ActionInterface<unsigned_short_(unsigned_short)> *)local_38._0_8_)->_vptr_ActionInterface =
       (_func_int **)&PTR__ActionInterface_001b0b60;
  *(undefined4 *)
   &((ActionInterface<unsigned_short_(unsigned_short)> *)(local_38._0_8_ + 8))->
    _vptr_ActionInterface = 0xccdd;
  *(undefined2 *)
   ((long)&((ActionInterface<unsigned_short_(unsigned_short)> *)(local_38._0_8_ + 8))->
           _vptr_ActionInterface + 4) = 0xccdd;
  local_38._8_8_ = local_38 + 8;
  local_48.value_ = (MatcherInterface<const_unsigned_short_&> *)0x0;
  local_48.link_.next_ = (linked_ptr_internal *)0x0;
  local_58 = (undefined1  [8])0x0;
  sStack_50.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::TypedExpectation<unsigned_short_(unsigned_short)>::WillOnce
            (this_02,(Action<unsigned_short_(unsigned_short)> *)local_58);
  testing::internal::linked_ptr<testing::ActionInterface<unsigned_short_(unsigned_short)>_>::
  ~linked_ptr((linked_ptr<testing::ActionInterface<unsigned_short_(unsigned_short)>_> *)local_38);
  if (local_48.value_ != (MatcherInterface<const_unsigned_short_&> *)0x0) {
    (*(code *)local_48.value_)(local_58,local_58,3);
  }
  testing::internal::linked_ptr<int>::depart(&local_88);
  local_78._8_8_ = &PTR__MatcherBase_001addc8;
  testing::internal::linked_ptr<const_testing::MatcherInterface<const_unsigned_short_&>_>::
  ~linked_ptr(&local_68);
  local_a0.super_MatcherBase<unsigned_short>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_001addc8;
  testing::internal::linked_ptr<const_testing::MatcherInterface<const_unsigned_short_&>_>::
  ~linked_ptr(&local_a0.super_MatcherBase<unsigned_short>.impl_);
  testing::Matcher<unsigned_short>::Matcher((Matcher<unsigned_short> *)local_78,0xccdd);
  testing::Matcher<unsigned_short>::Matcher(&local_a0,(this->super_CpuTest).regs.sp);
  this_01 = &(this->super_CpuTest).mmu.gmock2_write_word_13;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)this_01,mock_obj);
  testing::internal::FunctionMocker<void_(unsigned_short,_unsigned_short)>::With
            ((MockSpec<void_(unsigned_short,_unsigned_short)> *)local_58,this_01,
             (Matcher<unsigned_short> *)local_78,&local_a0);
  testing::internal::GetWithoutMatchers();
  testing::internal::MockSpec<void_(unsigned_short,_unsigned_short)>::InternalExpectedAt
            ((MockSpec<void_(unsigned_short,_unsigned_short)> *)local_58,
             "/workspace/llm4binary/github/license_all_cmakelists_25/cjuub[P]geemuboi/test/core/test_cpu.cpp"
             ,0xe4,"mmu","write_word(0xCCDD, regs.sp)");
  local_38._0_8_ = &PTR__MatcherBase_001addc8;
  testing::internal::linked_ptr<const_testing::MatcherInterface<const_unsigned_short_&>_>::
  ~linked_ptr((linked_ptr<const_testing::MatcherInterface<const_unsigned_short_&>_> *)(local_38 + 8)
             );
  sStack_50.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       &PTR__MatcherBase_001addc8;
  testing::internal::linked_ptr<const_testing::MatcherInterface<const_unsigned_short_&>_>::
  ~linked_ptr(&local_48);
  local_a0.super_MatcherBase<unsigned_short>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_001addc8;
  testing::internal::linked_ptr<const_testing::MatcherInterface<const_unsigned_short_&>_>::
  ~linked_ptr(&local_a0.super_MatcherBase<unsigned_short>.impl_);
  local_78._0_8_ = &PTR__MatcherBase_001addc8;
  testing::internal::linked_ptr<const_testing::MatcherInterface<const_unsigned_short_&>_>::
  ~linked_ptr((linked_ptr<const_testing::MatcherInterface<const_unsigned_short_&>_> *)(local_78 + 8)
             );
  CpuTest::execute_instruction(&this->super_CpuTest,'\b');
  local_78._0_8_ = (FunctionMockerBase<unsigned_short_(unsigned_short)> *)0x0;
  local_78._8_4_ = 0xffee0003;
  CpuTest::verify_state_changes(&this->super_CpuTest,(Registers *)local_78);
  iVar3 = (*((this->super_CpuTest).cpu._M_t.
             super___uniq_ptr_impl<geemuboi::core::ICpu,_std::default_delete<geemuboi::core::ICpu>_>
             ._M_t.
             super__Tuple_impl<0UL,_geemuboi::core::ICpu_*,_std::default_delete<geemuboi::core::ICpu>_>
             .super__Head_base<0UL,_geemuboi::core::ICpu_*,_false>._M_head_impl)->_vptr_ICpu[1])();
  local_a0.super_MatcherBase<unsigned_short>._vptr_MatcherBase =
       (_func_int **)
       CONCAT44(local_a0.super_MatcherBase<unsigned_short>._vptr_MatcherBase._4_4_,iVar3);
  local_88.value_ = (int *)CONCAT44(local_88.value_._4_4_,5);
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)local_58,"cpu->get_cycles_executed()","5",(uint *)&local_a0,
             (int *)&local_88);
  if (local_58[0] == '\0') {
    testing::Message::Message((Message *)&local_a0);
    if (sStack_50.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      message = "";
    }
    else {
      message = *(char **)sStack_50.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cjuub[P]geemuboi/test/core/test_cpu.cpp"
               ,0xec,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_88,(Message *)&local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
    if (local_a0.super_MatcherBase<unsigned_short>._vptr_MatcherBase != (_func_int **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_a0.super_MatcherBase<unsigned_short>._vptr_MatcherBase != (_func_int **)0x0)) {
        (**(code **)(*local_a0.super_MatcherBase<unsigned_short>._vptr_MatcherBase + 8))();
      }
      local_a0.super_MatcherBase<unsigned_short>._vptr_MatcherBase = (_func_int **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST_F(CpuTest, ld_ma16_sp) {
    regs.sp = 0xFFEE;
    EXPECT_CALL(mmu, read_word(regs.pc + 1)).WillOnce(Return(0xCCDD));
    EXPECT_CALL(mmu, write_word(0xCCDD, regs.sp));
    execute_instruction(0x08);

    ICpu::Registers expected_regs{};
    expected_regs.sp = 0xFFEE;
    expected_regs.pc = 3;
    verify_state_changes(expected_regs);

    EXPECT_EQ(cpu->get_cycles_executed(), 5);
}